

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

qint64 QBenchmarkValgrindUtils::extractLastResult(void)

{
  long lVar1;
  qint64 qVar2;
  long in_FS_OFFSET;
  QString *in_stack_00000028;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getNewestFileName();
  qVar2 = extractResult(in_stack_00000028);
  QString::~QString((QString *)0x1ae120);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractLastResult()
{
    return extractResult(getNewestFileName());
}